

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rc4.cc
# Opt level: O1

int main(int argc,char **argv)

{
  char *__s;
  char *filename;
  char *filename_00;
  int iVar1;
  size_t sVar2;
  uchar *key_data;
  FILE *__stream;
  long lVar3;
  FILE *__stream_00;
  Pl_StdioFile *this;
  Pl_RC4 *this_00;
  void *__buf;
  int *in_data;
  ostream *poVar4;
  uchar *in_RCX;
  FILE *__n;
  uchar *in_R8;
  uint uVar5;
  ulong uVar6;
  bool bVar7;
  uchar buf [100];
  RC4 local_98 [6];
  
  if (argc == 4) {
    __s = argv[1];
    filename = argv[2];
    filename_00 = argv[3];
    sVar2 = strlen(__s);
    if (sVar2 >> 0x20 != 0) {
      QIntC::IntConverter<unsigned_long,_unsigned_int,_false,_false>::error(sVar2);
    }
    uVar6 = sVar2 >> 1 & 0x7fffffff;
    iVar1 = (int)uVar6;
    key_data = (uchar *)operator_new__((ulong)(iVar1 + 1));
    key_data[uVar6] = '\0';
    __stream = (FILE *)QUtil::safe_fopen(filename,"rb");
    if (*__s != '\0') {
      uVar5 = 2;
      uVar6 = 0;
      do {
        local_98[0].crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
        _0_1_ = __s[uVar6];
        local_98[0].crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
        _1_1_ = __s[uVar5 - 1];
        local_98[0].crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
        _2_1_ = 0;
        lVar3 = strtol((char *)local_98,(char **)0x0,0x10);
        key_data[uVar5 - 2 >> 1] = (uchar)lVar3;
        uVar6 = (ulong)uVar5;
        sVar2 = strlen(__s);
        uVar5 = uVar5 + 2;
      } while (uVar6 < sVar2);
    }
    __stream_00 = (FILE *)QUtil::safe_fopen(filename_00,"wb");
    this = (Pl_StdioFile *)operator_new(0x38);
    Pl_StdioFile::Pl_StdioFile(this,"stdout",(FILE *)__stream_00);
    this_00 = (Pl_RC4 *)operator_new(0x58);
    Pl_RC4::Pl_RC4(this_00,"rc4",(Pipeline *)this,key_data,iVar1,0x40);
    operator_delete__(key_data);
    bVar7 = false;
    do {
      __n = __stream;
      __buf = (void *)fread(local_98,1,100,__stream);
      if (__buf == (void *)0x0) {
        bVar7 = true;
      }
      else {
        Pl_RC4::write(this_00,(int)local_98,__buf,(size_t)__n);
      }
    } while (!bVar7);
    Pl_RC4::finish(this_00);
    Pl_RC4::~Pl_RC4(this_00);
    operator_delete(this_00,0x58);
    (*(this->super_Pipeline)._vptr_Pipeline[1])(this);
    fclose(__stream);
    fclose(__stream_00);
  }
  else {
    if ((argc != 2) || (iVar1 = strcmp(argv[1],"other"), iVar1 != 0)) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Usage: rc4 hex-key infile outfile");
      std::endl<char,std::char_traits<char>>(poVar4);
      exit(2);
    }
    RC4::RC4(local_98,(RC4_KEY *)"quack",0xffffffff,in_RCX,in_R8);
    in_data = (int *)operator_new__(6);
    *(undefined2 *)(in_data + 1) = 0x6f74;
    *in_data = 0x61746f70;
    RC4::process(local_98,(uchar *)in_data,6,(uchar *)in_data);
    if ((short)in_data[1] != 0x5c2b || *in_data != 0x27e76fa5) {
      __assert_fail("memcmp(data.get(), \"\\xa5\\x6f\\xe7\\x27\\x2b\\x5c\", 6) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/rc4.cc"
                    ,0x16,"void other_tests()");
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"passed",6);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
    std::ostream::put(-0x80);
    std::ostream::flush();
    operator_delete__(in_data);
    if (local_98[0].crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98[0].crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  return 0;
}

Assistant:

int
main(int argc, char* argv[])
{
    if ((argc == 2) && (strcmp(argv[1], "other") == 0)) {
        other_tests();
        return 0;
    }

    if (argc != 4) {
        std::cerr << "Usage: rc4 hex-key infile outfile" << std::endl;
        exit(2);
    }

    char* hexkey = argv[1];
    char* infilename = argv[2];
    char* outfilename = argv[3];
    unsigned int hexkeylen = QIntC::to_uint(strlen(hexkey));
    unsigned int keylen = hexkeylen / 2;
    auto* key = new unsigned char[keylen + 1];
    key[keylen] = '\0';

    FILE* infile = QUtil::safe_fopen(infilename, "rb");
    for (unsigned int i = 0; i < strlen(hexkey); i += 2) {
        char t[3];
        t[0] = hexkey[i];
        t[1] = hexkey[i + 1];
        t[2] = '\0';

        long val = strtol(t, nullptr, 16);
        key[i / 2] = static_cast<unsigned char>(val);
    }

    FILE* outfile = QUtil::safe_fopen(outfilename, "wb");
    auto* out = new Pl_StdioFile("stdout", outfile);
    // Use a small buffer size (64) for testing
    auto* rc4 = new Pl_RC4("rc4", out, key, QIntC::to_int(keylen), 64U);
    delete[] key;

    // 64 < buffer size < 512, buffer_size is not a power of 2 for testing
    unsigned char buf[100];
    bool done = false;
    while (!done) {
        size_t len = fread(buf, 1, sizeof(buf), infile);
        if (len <= 0) {
            done = true;
        } else {
            rc4->write(buf, len);
        }
    }
    rc4->finish();
    delete rc4;
    delete out;
    fclose(infile);
    fclose(outfile);
    return 0;
}